

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_ObjDead(FParser *this)

{
  uint uVar1;
  bool bVar2;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *mo;
  FParser *this_local;
  
  mo = (AActor *)this;
  if (this->t_argc == 0) {
    local_18 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
  }
  else {
    local_18 = actorvalue(this->t_argv);
  }
  (this->t_return).type = 1;
  bVar2 = false;
  if ((local_18 != (AActor *)0x0) && (bVar2 = true, 0 < local_18->health)) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_1c,
               (int)local_18 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
    bVar2 = uVar1 != 0;
  }
  if (bVar2) {
    (this->t_return).value.i = 1;
  }
  else {
    (this->t_return).value.i = 0;
  }
  return;
}

Assistant:

void FParser::SF_ObjDead()
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.type = svt_int;
	if(mo && (mo->health <= 0 || mo->flags&MF_CORPSE))
		t_return.value.i = 1;
	else
		t_return.value.i = 0;
}